

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t dim)

{
  complex<double> *local_20;
  
  TPZMatrix<std::complex<double>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<double>_>,&PTR_PTR_01688a88,dim,dim);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_01688800;
  TPZVec<std::complex<double>_*>::TPZVec(&this->fElem,dim + 1);
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0164ea78;
  (this->fStorage).fStore = (complex<double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  local_20 = (complex<double> *)0x0;
  TPZVec<std::complex<double>_*>::Fill(&this->fElem,&local_20,0,-1);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
}